

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::VariableDatum::Decode(VariableDatum *this,KDataStream *stream)

{
  pointer pDVar1;
  KUINT16 KVar2;
  KException *this_00;
  KUINT16 j;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  KOCTET o;
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  *local_58;
  DatumEntry de;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  if (7 < KVar2) {
    pDVar1 = (this->m_v8DatumValue).
             super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_v8DatumValue).
        super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish != pDVar1) {
      (this->m_v8DatumValue).
      super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar1;
    }
    local_58 = &this->m_v8DatumValue;
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32DatumID);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32DatumLength);
    dVar6 = ceil((double)this->m_ui32DatumLength * 0.125);
    dVar6 = ceil(dVar6 * 0.125);
    uVar3 = 0;
    while( true ) {
      uVar5 = (uint)(long)(dVar6 * 8.0);
      if (uVar5 <= (uVar3 & 0xffff)) break;
      de.Buffer[0] = '\0';
      de.Buffer[1] = '\0';
      de.Buffer[2] = '\0';
      de.Buffer[3] = '\0';
      de.Buffer[4] = '\0';
      de.Buffer[5] = '\0';
      de.Buffer[6] = '\0';
      de.Buffer[7] = '\0';
      for (uVar4 = 0; (((uVar3 & 0xffff) + (int)uVar4 & 0xffff) < uVar5 && (uVar4 < 8));
          uVar4 = uVar4 + 1) {
        KDataStream::Read(stream,&o);
        de.Buffer[uVar4] = o;
      }
      std::
      vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ::push_back(local_58,&de);
      uVar3 = (int)uVar4 + uVar3;
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&de,"Decode",(allocator<char> *)&o);
  KException::KException(this_00,(KString *)&de,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void VariableDatum::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VARIABLE_DATUM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_v8DatumValue.clear();

    stream >> m_ui32DatumID
           >> m_ui32DatumLength;

    KUINT32 ui32LengthInOctets = ceil(ceil(m_ui32DatumLength / 8.0) / 8.0) * 8;

    // Datum length is returned in bits, so we need to convert to octets
    for( KUINT16 i = 0; i < ui32LengthInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            KOCTET o;
            stream >> o;
            de.Buffer[j] = o;
        }
        m_v8DatumValue.push_back( de );
    }
}